

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O2

unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> __thiscall
lunasvg::Document::loadFromFile(Document *this,string *filename)

{
  char cVar1;
  string content;
  ifstream fs;
  
  std::ifstream::ifstream((string *)&fs);
  std::ifstream::open((string *)&fs,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    (this->m_rootElement)._M_t.
    super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>.
    _M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
    .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl = (SVGRootElement *)0x0;
  }
  else {
    content._M_dataplus._M_p = (pointer)&content.field_2;
    content._M_string_length = 0;
    content.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&fs,(string *)&content,'\0');
    std::ifstream::close();
    loadFromData(this,&content);
    std::__cxx11::string::~string((string *)&content);
  }
  std::ifstream::~ifstream(&fs);
  return (__uniq_ptr_data<lunasvg::Document,_std::default_delete<lunasvg::Document>,_true,_true>)
         (__uniq_ptr_data<lunasvg::Document,_std::default_delete<lunasvg::Document>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Document> Document::loadFromFile(const std::string& filename)
{
    std::ifstream fs;
    fs.open(filename);
    if(!fs.is_open())
        return nullptr;
    std::string content;
    std::getline(fs, content, '\0');
    fs.close();
    return loadFromData(content);
}